

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# g_bang.c
# Opt level: O2

void bng_dialog(t_bng *x,t_symbol *s,int argc,t_atom *argv)

{
  _glist *canvas;
  int iVar1;
  int iVar2;
  t_symbol *s_00;
  int iVar3;
  t_float tVar4;
  t_float tVar5;
  t_symbol *srl [3];
  t_atom undo [18];
  
  tVar4 = atom_getfloatarg(0,argc,argv);
  tVar5 = atom_getfloatarg(2,argc,argv);
  iVar3 = (int)tVar5;
  tVar5 = atom_getfloatarg(3,argc,argv);
  iVar1 = (int)tVar5;
  iemgui_setdialogatoms(&x->x_gui,0x12,undo);
  undo[1].a_type = A_FLOAT;
  undo[1].a_w.w_float = 0.0;
  undo[2].a_w._0_4_ = (undefined4)x->x_flashtime_break;
  undo[3].a_w._0_4_ = (undefined4)x->x_flashtime_hold;
  canvas = (x->x_gui).x_glist;
  undo[2].a_type = undo[1].a_type;
  undo[3].a_type = undo[1].a_type;
  s_00 = gensym("dialog");
  pd_undo_set_objectstate(canvas,(t_pd *)x,s_00,0x12,undo,argc,argv);
  iemgui_dialog(&x->x_gui,srl,argc,argv);
  iVar2 = iemgui_clip_size((int)tVar4);
  iVar2 = iVar2 * ((x->x_gui).x_glist)->gl_zoom;
  (x->x_gui).x_w = iVar2;
  (x->x_gui).x_h = iVar2;
  iVar2 = iVar3;
  if (iVar3 < iVar1) {
    iVar2 = iVar1;
  }
  if (iVar1 < iVar3) {
    iVar3 = iVar1;
  }
  iVar1 = 10;
  if (10 < iVar3) {
    iVar1 = iVar3;
  }
  iVar3 = 0x32;
  if (0x32 < iVar2) {
    iVar3 = iVar2;
  }
  x->x_flashtime_break = iVar1;
  x->x_flashtime_hold = iVar3;
  iemgui_size(x,&x->x_gui);
  return;
}

Assistant:

static void bng_dialog(t_bng *x, t_symbol *s, int argc, t_atom *argv)
{
    t_symbol *srl[3];
    int a = (int)atom_getfloatarg(0, argc, argv);
    int fthold = (int)atom_getfloatarg(2, argc, argv);
    int ftbreak = (int)atom_getfloatarg(3, argc, argv);
    int sr_flags;

    t_atom undo[18];
    iemgui_setdialogatoms(&x->x_gui, 18, undo);
    SETFLOAT (undo+1, 0);
    SETFLOAT (undo+2, x->x_flashtime_break);
    SETFLOAT (undo+3, x->x_flashtime_hold);
    pd_undo_set_objectstate(x->x_gui.x_glist, (t_pd*)x, gensym("dialog"),
                            18, undo,
                            argc, argv);

    sr_flags = iemgui_dialog(&x->x_gui, srl, argc, argv);
    x->x_gui.x_w = iemgui_clip_size(a) * IEMGUI_ZOOM(x);
    x->x_gui.x_h = x->x_gui.x_w;
    bng_check_minmax(x, ftbreak, fthold);

    iemgui_size((void *)x, &x->x_gui);
}